

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_strncasecmp(char *s1,char *s2,size_t n)

{
  char cVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  char c2;
  char c1;
  long local_20;
  char *local_18;
  char *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (local_20 == 0) {
      return 0;
    }
    iVar2 = toupper((int)*local_10);
    cVar1 = (char)iVar2;
    iVar2 = toupper((int)*local_18);
    if (cVar1 < (char)iVar2) {
      return -1;
    }
    if ((char)iVar2 < cVar1) {
      return 1;
    }
    if (cVar1 == '\0') break;
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
    local_20 = local_20 + -1;
  }
  return 0;
}

Assistant:

int fits_strncasecmp(const char *s1, const char *s2, size_t n)
{
   char c1, c2;

   for (; n-- ;) {
      c1 = toupper( *s1 );
      c2 = toupper( *s2 );

      if (c1 < c2) return(-1);
      if (c1 > c2) return(1);
      if (c1 == 0) return(0);
      s1++;
      s2++;
   }
   return(0);
}